

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::add_msl_shader_input(CompilerMSL *this,MSLShaderInput *si)

{
  MSLShaderInputFormat MVar1;
  uint32_t uVar2;
  MSLShaderInput *pMVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  bool bVar7;
  BuiltIn local_20;
  BuiltIn local_1c;
  MSLShaderInput *local_18;
  MSLShaderInput *si_local;
  CompilerMSL *this_local;
  
  local_18 = si;
  si_local = (MSLShaderInput *)this;
  pmVar4 = ::std::
           map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
           ::operator[](&this->inputs_by_location,&si->location);
  MVar1 = si->format;
  pmVar4->location = si->location;
  pmVar4->format = MVar1;
  uVar2 = si->vecsize;
  pmVar4->builtin = si->builtin;
  pmVar4->vecsize = uVar2;
  bVar7 = false;
  if (local_18->builtin != BuiltInMax) {
    local_1c = local_18->builtin;
    sVar5 = ::std::
            unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
            ::count(&this->inputs_by_builtin,&local_1c);
    bVar7 = sVar5 == 0;
  }
  pMVar3 = local_18;
  if (bVar7) {
    local_20 = local_18->builtin;
    pmVar6 = ::std::
             unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
             ::operator[](&this->inputs_by_builtin,&local_20);
    MVar1 = pMVar3->format;
    pmVar6->location = pMVar3->location;
    pmVar6->format = MVar1;
    uVar2 = pMVar3->vecsize;
    pmVar6->builtin = pMVar3->builtin;
    pmVar6->vecsize = uVar2;
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_input(const MSLShaderInput &si)
{
	inputs_by_location[si.location] = si;
	if (si.builtin != BuiltInMax && !inputs_by_builtin.count(si.builtin))
		inputs_by_builtin[si.builtin] = si;
}